

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

void SwpWrd(char *wrd,int siz)

{
  char cVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = siz + -1;
  for (lVar2 = 0; lVar2 < siz / 2; lVar2 = lVar2 + 1) {
    cVar1 = wrd[iVar3];
    wrd[iVar3] = wrd[lVar2];
    wrd[lVar2] = cVar1;
    iVar3 = iVar3 + -1;
  }
  return;
}

Assistant:

static void SwpWrd(char *wrd, int siz)
{
   char  swp;
   int   i;

   for(i=0;i<siz/2;i++)
   {
      swp = wrd[ siz-i-1 ];
      wrd[ siz-i-1 ] = wrd[i];
      wrd[i] = swp;
   }
}